

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void make_int_list(vm_val_t *retval,int cnt,...)

{
  char in_AL;
  vm_obj_id_t obj;
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  vm_val_t *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  vm_val_t ele;
  int i;
  va_list args;
  CVmObjList *lst;
  size_t in_stack_fffffffffffffed8;
  int32_t *idx;
  undefined8 in_stack_fffffffffffffee0;
  CVmObjList *this;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  vm_val_t local_50;
  int local_3c;
  CVmObjList local_38;
  undefined1 *local_28;
  CVmObject *local_18;
  int local_c;
  vm_val_t *local_8;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_c = in_ESI;
  local_8 = in_RDI;
  obj = CVmObjList::create((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),in_stack_fffffffffffffed8
                          );
  vm_val_t::set_obj(in_RDI,obj);
  local_18 = vm_objp(0);
  local_28 = local_108;
  local_38.super_CVmObjCollection.super_CVmObject.ext_ = &stack0x00000008;
  local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject._4_4_ = 0x30;
  local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject._0_4_ = 0x10;
  for (local_3c = 0; local_3c < local_c; local_3c = local_3c + 1) {
    this = &local_38;
    if ((uint)local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject < 0x29) {
      lVar1 = (long)(int)(uint)local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject;
      local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject._0_4_ =
           (uint)local_38.super_CVmObjCollection.super_CVmObject._vptr_CVmObject + 8;
      idx = (int32_t *)(local_28 + lVar1);
    }
    else {
      idx = (int32_t *)local_38.super_CVmObjCollection.super_CVmObject.ext_;
      local_38.super_CVmObjCollection.super_CVmObject.ext_ =
           (char *)((long)local_38.super_CVmObjCollection.super_CVmObject.ext_ + 8);
    }
    vm_val_t::set_int(&local_50,*idx);
    CVmObjList::cons_set_element(this,(size_t)idx,(vm_val_t *)0x347c8e);
  }
  return;
}

Assistant:

static void make_int_list(VMG_ vm_val_t *retval, int cnt, ...)
{
    /* create the list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, cnt));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* start the varargs scan */
    va_list args;
    va_start(args, cnt);

    /* add the elements */
    for (int i = 0 ; i < cnt ; ++i)
    {
        vm_val_t ele;
        ele.set_int(va_arg(args, int));
        lst->cons_set_element(i, &ele);
    }

    /* done with the varargs */
    va_end(args);
}